

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall MT32Emu::MidiEventQueue::~MidiEventQueue(MidiEventQueue *this)

{
  Bit32u i;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 <= this->ringBufferMask; uVar1 = uVar1 + 1) {
    (*this->sysexDataStorage->_vptr_SysexDataStorage[4])
              (this->sysexDataStorage,this->ringBuffer[uVar1].sysexData,
               (ulong)this->ringBuffer[uVar1].field_1.sysexLength);
  }
  if (this->sysexDataStorage != (SysexDataStorage *)0x0) {
    (*this->sysexDataStorage->_vptr_SysexDataStorage[1])();
  }
  if (this->ringBuffer != (MidiEvent *)0x0) {
    operator_delete__(this->ringBuffer);
    return;
  }
  return;
}

Assistant:

MidiEventQueue::~MidiEventQueue() {
	for (Bit32u i = 0; i <= ringBufferMask; i++) {
		volatile MidiEvent &currentEvent = ringBuffer[i];
		sysexDataStorage.dispose(currentEvent.sysexData, currentEvent.sysexLength);
	}
	delete &sysexDataStorage;
	delete[] ringBuffer;
}